

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O3

Type * __thiscall slang::ast::PortSymbol::getType(PortSymbol *this)

{
  Type *this_00;
  SyntaxNode *pSVar1;
  SourceLocation SVar2;
  bitmask<slang::ast::AssignFlags> assignFlags;
  bool bVar3;
  int iVar4;
  DeclaredType *this_01;
  Type *pTVar5;
  Expression *pEVar6;
  Expression *pEVar7;
  undefined4 extraout_var;
  Diagnostic *pDVar8;
  PortReferenceSyntax *prs;
  ArgumentDirection direction;
  SourceRange sourceRange;
  Type *errorType;
  PortBackrefVisitor visitor;
  not_null<const_slang::ast::Scope_*> in_stack_ffffffffffffffa0;
  PortBackrefVisitor local_28;
  
  if (this->type != (Type *)0x0) {
    return this->type;
  }
  this_00 = (Type *)(this->super_Symbol).parentScope;
  pSVar1 = (this->super_Symbol).originatingSyntax;
  if (this->internalSymbol == (Symbol *)0x0) {
    if (this->isNullPort == true) {
      this->type = (*(Compilation **)&this_00->super_Symbol)->voidType;
    }
    else {
      direction = this->direction;
      if ((ulong)direction < 3) {
        direction = *(ArgumentDirection *)(&DAT_00486598 + (ulong)direction * 4);
      }
      in_stack_ffffffffffffffa0.ptr = (Scope *)this_00;
      iVar4 = Expression::bind((int)*(undefined8 *)(pSVar1 + 6),(sockaddr *)&stack0xffffffffffffffa0
                               ,0);
      pEVar6 = (Expression *)CONCAT44(extraout_var,iVar4);
      this->internalExpr = pEVar6;
      this->type = (pEVar6->type).ptr;
      bVar3 = Expression::bad(pEVar6);
      if (!bVar3) {
        Expression::checkConnectionDirection
                  (this->internalExpr,direction,(ASTContext *)&stack0xffffffffffffffa0,
                   (this->super_Symbol).location,
                   (bitmask<slang::ast::AssignFlags>)((this->direction == In) << 2));
        local_28.port = this;
        Expression::visit<slang::ast::(anonymous_namespace)::PortBackrefVisitor&>
                  (this->internalExpr,&local_28);
      }
    }
  }
  else {
    this_01 = Symbol::getDeclaredType(this->internalSymbol);
    pTVar5 = DeclaredType::getType(this_01);
    this->type = pTVar5;
    LookupLocation::before(&this->super_Symbol);
    SVar2 = (this->super_Symbol).location;
    sourceRange.startLoc = (this->super_Symbol).name._M_len * 0x10000000 + (long)SVar2;
    sourceRange.endLoc = (SourceLocation)0x0;
    in_stack_ffffffffffffffa0.ptr = (Scope *)this_00;
    pEVar6 = ValueExpressionBase::fromSymbol
                       ((ValueExpressionBase *)&stack0xffffffffffffffa0,
                        (ASTContext *)this->internalSymbol,(Symbol *)0x0,
                        (HierarchicalReference *)SVar2,sourceRange,false,SUB81(this_00,0));
    if ((pSVar1->kind == PortReference) &&
       ((ElementSelectSyntax *)pSVar1[1].previewNode != (ElementSelectSyntax *)0x0)) {
      pEVar7 = Expression::bindSelector
                         (pEVar6,(ElementSelectSyntax *)pSVar1[1].previewNode,
                          (ASTContext *)&stack0xffffffffffffffa0);
      this->internalExpr = pEVar7;
      this->type = (pEVar7->type).ptr;
    }
    ValueSymbol::addPortBackref((ValueSymbol *)this->internalSymbol,this);
    if ((this->direction & ~InOut) == In) {
      assignFlags.m_bits = '\x10';
      if (this->direction == In) {
        assignFlags.m_bits = '\x04';
      }
      if (this->internalExpr == (Expression *)0x0) {
        ASTContext::addDriver
                  ((ASTContext *)&stack0xffffffffffffffa0,(ValueSymbol *)this->internalSymbol,pEVar6
                   ,assignFlags);
      }
      else {
        Expression::requireLValue
                  (this->internalExpr,(ASTContext *)&stack0xffffffffffffffa0,(SourceLocation)0x0,
                   assignFlags,(Expression *)0x0);
      }
    }
  }
  bVar3 = Type::isValidForPort(this->type,(Type **)&stack0xffffffffffffffa0);
  if (!bVar3) {
    SVar2 = (this->super_Symbol).location;
    if ((Type *)in_stack_ffffffffffffffa0.ptr == this->type) {
      pDVar8 = Scope::addDiag((Scope *)this_00,(DiagCode)0x5e0006,SVar2);
      in_stack_ffffffffffffffa0.ptr = (Scope *)this->type;
    }
    else {
      pDVar8 = Scope::addDiag((Scope *)this_00,(DiagCode)0x5d0006,SVar2);
      pDVar8 = ast::operator<<(pDVar8,this->type);
    }
    ast::operator<<(pDVar8,(Type *)in_stack_ffffffffffffffa0.ptr);
  }
  return this->type;
}

Assistant:

const Type& PortSymbol::getType() const {
    if (type)
        return *type;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    SLANG_ASSERT(scope && syntax);

    if (internalSymbol) {
        auto dt = internalSymbol->getDeclaredType();
        SLANG_ASSERT(dt);
        type = &dt->getType();

        bitmask<ASTFlags> astFlags = ASTFlags::NonProcedural | ASTFlags::AllowInterconnect |
                                     ASTFlags::NoReference;
        if (direction != ArgumentDirection::Out)
            astFlags |= ASTFlags::LValue;

        ASTContext context(*scope, LookupLocation::before(*this), astFlags);

        auto& valExpr = ValueExpressionBase::fromSymbol(context, *internalSymbol, nullptr,
                                                        {location, location + name.length()});

        if (syntax->kind == SyntaxKind::PortReference) {
            auto& prs = syntax->as<PortReferenceSyntax>();
            if (auto select = prs.select) {
                internalExpr = &Expression::bindSelector(valExpr, *select, context);
                type = internalExpr->type;
            }
        }

        internalSymbol->as<ValueSymbol>().addPortBackref(*this);
        if (direction == ArgumentDirection::In || direction == ArgumentDirection::InOut) {
            // Ensure that this driver gets registered with the internal symbol.
            auto flags = direction == ArgumentDirection::In ? AssignFlags::InputPort
                                                            : AssignFlags::InOutPort;
            if (internalExpr) {
                internalExpr->requireLValue(context, {}, flags);
            }
            else {
                context.addDriver(internalSymbol->as<ValueSymbol>(), valExpr, flags);
            }
        }
    }
    else if (isNullPort) {
        type = &scope->getCompilation().getVoidType();
    }
    else {
        // We should have an explicit port connection expression here.
        auto& eaps = syntax->as<ExplicitAnsiPortSyntax>();
        SLANG_ASSERT(eaps.expr);

        // The direction of the connection is reversed, as data coming in to an input
        // port flows out to the internal symbol, and vice versa. Inout and ref
        // ports don't change.
        bitmask<ASTFlags> astFlags = ASTFlags::NonProcedural | ASTFlags::NoReference;
        ArgumentDirection checkDir = direction;
        switch (direction) {
            case ArgumentDirection::In:
                checkDir = ArgumentDirection::Out;
                astFlags |= ASTFlags::LValue;
                break;
            case ArgumentDirection::Out:
                checkDir = ArgumentDirection::In;
                break;
            case ArgumentDirection::InOut:
                astFlags |= ASTFlags::LValue;
                break;
            case ArgumentDirection::Ref:
                break;
        }

        ASTContext context(*scope, LookupLocation::max, astFlags);
        internalExpr = &Expression::bind(*eaps.expr, context);
        type = internalExpr->type;

        if (!internalExpr->bad()) {
            Expression::checkConnectionDirection(*internalExpr, checkDir, context, location,
                                                 direction == ArgumentDirection::In
                                                     ? AssignFlags::InputPort
                                                     : AssignFlags::None);

            PortBackrefVisitor visitor(*this);
            internalExpr->visit(visitor);
        }
    }

    const Type* errorType;
    if (!type->isValidForPort(&errorType)) {
        if (errorType == type)
            scope->addDiag(diag::InvalidPortType, location) << *type;
        else
            scope->addDiag(diag::InvalidPortSubType, location) << *type << *errorType;
    }

    return *type;
}